

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
add_file::perform(add_file *this,filesystemcollection *fslist,readercollection *rdlist)

{
  FileReader *__p;
  undefined8 *puVar1;
  ReadWriter_ptr r;
  FileContainer_ptr fs;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (1 < g_verbose) {
    printf("adding %s:%s from %s\n",(this->_fsname)._M_dataplus._M_p,
           (this->_romname)._M_dataplus._M_p,(this->_srcpath)._M_dataplus._M_p);
  }
  filesystemcollection::getbyname((filesystemcollection *)&fs,(string *)fslist);
  if (fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    __p = (FileReader *)operator_new(0x40);
    FileReader::FileReader(__p,&this->_srcpath);
    std::__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileReader,void>
              ((__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2> *)&r,__p);
    std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,&r.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
    (*(fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_FileContainer
      [2])(fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&this->_romname,
           &local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&r.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "add: invalid fsname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose > 1)
            printf("adding %s:%s from %s\n", _fsname.c_str(), _romname.c_str(), _srcpath.c_str());
        FileContainer_ptr fs= fslist.getbyname(_fsname);
        if (!fs) throw "add: invalid fsname";

        ReadWriter_ptr r(new FileReader(_srcpath, FileReader::readonly));
        fs->addfile(_romname, r);
    }